

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptOperators::OrdinaryCreateFromConstructor
          (RecyclableObject *constructor,RecyclableObject *obj,DynamicObject *intrinsicProto,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  DynamicObject *pDVar6;
  Type TVar7;
  Var local_48;
  Var value;
  ScriptContext *local_38;
  
  value = intrinsicProto;
  GetProperty_InternalSimple(constructor,constructor,0x124,&local_48,scriptContext);
  if (local_48 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aceb2e;
    *puVar4 = 0;
  }
  local_38 = scriptContext;
  if (((ulong)local_48 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)local_48 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aceb2e;
    *puVar4 = 0;
  }
  TVar7 = TypeIds_FirstNumberType;
  if ((((ulong)local_48 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar7 = TypeIds_Number, (ulong)local_48 >> 0x32 == 0)) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(local_48);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aceb2e;
      *puVar4 = 0;
    }
    TVar7 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar7) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_00aceb2e:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  if (0x16 < (int)TVar7) {
    pDVar6 = VarTo<Js::DynamicObject>(local_48);
    if (pDVar6 != (DynamicObject *)value) {
      pRVar5 = VarTo<Js::RecyclableObject>(local_48);
      JavascriptObject::ChangePrototype(obj,pRVar5,true,local_38);
    }
  }
  return obj;
}

Assistant:

RecyclableObject* JavascriptOperators::OrdinaryCreateFromConstructor(RecyclableObject* constructor, RecyclableObject* obj, DynamicObject* intrinsicProto, ScriptContext* scriptContext)
    {
        // There isn't a good way for us to add internal properties to objects in Chakra.
        // Thus, caller should take care to create obj with the correct internal properties.

        Var proto = JavascriptOperators::GetPropertyNoCache(constructor, Js::PropertyIds::prototype, scriptContext);

        // If constructor.prototype is an object, we should use that as the [[Prototype]] for our obj.
        // Else, we set the [[Prototype]] internal slot of obj to %intrinsicProto% - which should be the default.
        if (JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(proto)) &&
            VarTo<DynamicObject>(proto) != intrinsicProto)
        {
            JavascriptObject::ChangePrototype(obj, VarTo<RecyclableObject>(proto), /*validate*/true, scriptContext);
        }

        return obj;
    }